

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

void __thiscall bloaty::Bloaty::AddDataSource(Bloaty *this,string *name)

{
  iterator iVar1;
  Arg *in_R8;
  string_view format;
  string local_60;
  ConfiguredDataSource *local_40;
  pointer local_38;
  
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string_const&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->source_names_,name);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>_>_>_>
          ::find(&(this->all_known_sources_)._M_t,name);
  if ((_Rb_tree_header *)iVar1._M_node !=
      &(this->all_known_sources_)._M_t._M_impl.super__Rb_tree_header) {
    local_40 = *(ConfiguredDataSource **)(iVar1._M_node + 2);
    std::vector<bloaty::ConfiguredDataSource*,std::allocator<bloaty::ConfiguredDataSource*>>::
    emplace_back<bloaty::ConfiguredDataSource*>
              ((vector<bloaty::ConfiguredDataSource*,std::allocator<bloaty::ConfiguredDataSource*>>
                *)&this->sources_,&local_40);
    return;
  }
  local_38 = (name->_M_dataplus)._M_p;
  local_40 = (ConfiguredDataSource *)name->_M_string_length;
  format._M_str = (char *)&local_40;
  format._M_len = (size_t)"no such data source: $0.\nTry --list-sources to see valid sources.";
  absl::Substitute_abi_cxx11_(&local_60,(absl *)0x41,format,in_R8);
  Throw(local_60._M_dataplus._M_p,0x66b);
}

Assistant:

void Bloaty::AddDataSource(const std::string& name) {
  source_names_.emplace_back(name);
  auto it = all_known_sources_.find(name);
  if (it == all_known_sources_.end()) {
    THROWF("no such data source: $0.\nTry --list-sources to see valid sources.",
           name);
  }

  sources_.emplace_back(it->second.get());
}